

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.cpp
# Opt level: O0

ostream * operator<<(ostream *stream,buffer *buffer)

{
  bool bVar1;
  ostream *poVar2;
  byte *pbVar3;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_38;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_30;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_28;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_20;
  const_iterator it;
  buffer *buffer_local;
  ostream *stream_local;
  
  it._M_current = (uchar *)buffer;
  poVar2 = std::operator<<(stream,"[");
  std::ostream::operator<<(poVar2,std::hex);
  local_20._M_current =
       (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin(it._M_current);
  while( true ) {
    local_28._M_current =
         (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end(it._M_current);
    bVar1 = __gnu_cxx::operator!=(&local_20,&local_28);
    if (!bVar1) break;
    pbVar3 = __gnu_cxx::
             __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
             ::operator*(&local_20);
    std::ostream::operator<<(stream,(uint)*pbVar3);
    local_38._M_current =
         (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end(it._M_current);
    local_30 = __gnu_cxx::
               __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
               ::operator-(&local_38,1);
    bVar1 = __gnu_cxx::operator!=(&local_20,&local_30);
    if (bVar1) {
      std::operator<<(stream,", ");
    }
    __gnu_cxx::
    __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::operator++(&local_20);
  }
  poVar2 = std::operator<<(stream,"]");
  return poVar2;
}

Assistant:

std::ostream& operator<<(std::ostream& stream, const buffer& buffer)
{
    stream << "[" << std::hex;

    for(auto it = buffer.begin(); it != buffer.end(); ++it)
    {
        stream << static_cast<int>(*it);
        if(it != buffer.end() - 1)
        {
            stream << ", ";
        }
    }

    return stream << "]";
}